

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_scale(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  size_t sVar2;
  CVmObjBigNum *in_RDI;
  int scale;
  size_t prec;
  char *new_ext;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char **in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  char *__src;
  undefined8 in_stack_ffffffffffffffa0;
  vm_obj_id_t self_00;
  char *local_30;
  
  self_00 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  sVar2 = get_prec((char *)0x3061da);
  if ((getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_scale::desc,1);
    __cxa_guard_release(&getp_scale(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff98,(uint *)in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 == 0) {
    CVmBif::pop_int_val();
    iVar1 = setup_getp_retval(in_RDI,self_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                              CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (iVar1 == 0) {
      __src = (in_RDI->super_CVmObject).ext_;
      sVar2 = calc_alloc(sVar2);
      memcpy(local_30,__src,sVar2);
      get_exp((char *)0x3062dc);
      set_exp(local_30,in_stack_ffffffffffffff8c);
      CVmStack::discard();
    }
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_scale(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    int scale;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the scaling argument */
    scale = CVmBif::pop_int_val(vmg0_);

    /* set up the return value */
    if (setup_getp_retval(vmg_ self, retval, &new_ext, prec))
        return TRUE;
    
    /* copy the value */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* adjust the exponent by the scale factor */
    set_exp(new_ext, get_exp(new_ext) + scale);

    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}